

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitIsop.c
# Opt level: O2

int Kit_TruthIsop2(uint *puTruth0,uint *puTruth1,int nVars,Vec_Int_t *vMemory,int fTryBoth,
                  int fReturnTt)

{
  uint __line;
  int iVar1;
  uint *pIn2;
  uint **ppuVar2;
  int *piVar3;
  int nSizeNew;
  char *__assertion;
  ulong uVar4;
  Kit_Sop_t cRes;
  Kit_Sop_t cRes2;
  
  if ((uint)nVars < 0x11) {
    vMemory->nSize = 0;
    Vec_IntGrow(vMemory,(int)puTruth1);
    Kit_TruthNot(puTruth0,puTruth0,nVars);
    pIn2 = Kit_TruthIsop_rec(puTruth1,puTruth0,nVars,&cRes,vMemory);
    Kit_TruthNot(puTruth0,puTruth0,nVars);
    if (cRes.nCubes == -1) {
      vMemory->nSize = -1;
      return -1;
    }
    iVar1 = Kit_TruthIsImply(puTruth1,pIn2,nVars);
    if (iVar1 == 0) {
      __assertion = "Kit_TruthIsImply( puTruth1, pResult, nVars )";
      __line = 0x4a;
    }
    else {
      Kit_TruthNot(puTruth0,puTruth0,nVars);
      iVar1 = Kit_TruthIsImply(pIn2,puTruth0,nVars);
      if (iVar1 != 0) {
        Kit_TruthNot(puTruth0,puTruth0,nVars);
        if ((cRes.nCubes == 0) || ((cRes.nCubes == 1 && (*cRes.pCubes == 0)))) {
          *vMemory->pArray = 0;
          Vec_IntShrink(vMemory,cRes.nCubes);
          return 0;
        }
        ppuVar2 = &cRes.pCubes;
        piVar3 = &cRes.nCubes;
        if (fTryBoth == 0) {
          iVar1 = 0;
        }
        else {
          Kit_TruthNot(puTruth1,puTruth1,nVars);
          pIn2 = Kit_TruthIsop_rec(puTruth0,puTruth1,nVars,&cRes2,vMemory);
          Kit_TruthNot(puTruth1,puTruth1,nVars);
          if (-1 < cRes2.nCubes) {
            iVar1 = Kit_TruthIsImply(puTruth0,pIn2,nVars);
            if (iVar1 == 0) {
              __assertion = "Kit_TruthIsImply( puTruth0, pResult, nVars )";
              __line = 0x5c;
              goto LAB_004cf2f4;
            }
            Kit_TruthNot(puTruth1,puTruth1,nVars);
            iVar1 = Kit_TruthIsImply(pIn2,puTruth1,nVars);
            if (iVar1 == 0) {
              __assertion = "Kit_TruthIsImply( pResult, puTruth1, nVars )";
              __line = 0x5e;
              goto LAB_004cf2f4;
            }
            Kit_TruthNot(puTruth1,puTruth1,nVars);
            if ((cRes2.nCubes < cRes.nCubes) ||
               ((cRes.nCubes == cRes2.nCubes && (cRes2.nLits < cRes.nLits)))) {
              ppuVar2 = &cRes2.pCubes;
              piVar3 = &cRes2.nCubes;
              iVar1 = 1;
              goto LAB_004cf244;
            }
          }
          iVar1 = 0;
          ppuVar2 = &cRes.pCubes;
          piVar3 = &cRes.nCubes;
        }
LAB_004cf244:
        if (fReturnTt == 0) {
          nSizeNew = *piVar3;
          memmove(vMemory->pArray,*ppuVar2,(long)nSizeNew << 2);
        }
        else {
          uVar4 = (ulong)(uint)(1 << ((char)nVars - 5U & 0x1f));
          if ((uint)nVars < 6) {
            uVar4 = 1;
          }
          memmove(vMemory->pArray,pIn2,uVar4 * 4);
          nSizeNew = (int)uVar4;
        }
        Vec_IntShrink(vMemory,nSizeNew);
        return iVar1;
      }
      __assertion = "Kit_TruthIsImply( pResult, puTruth0, nVars )";
      __line = 0x4c;
    }
  }
  else {
    __assertion = "nVars >= 0 && nVars <= 16";
    __line = 0x3d;
  }
LAB_004cf2f4:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitIsop.c"
                ,__line,
                "int Kit_TruthIsop2(unsigned int *, unsigned int *, int, Vec_Int_t *, int, int)");
}

Assistant:

int Kit_TruthIsop2( unsigned * puTruth0, unsigned * puTruth1, int nVars, Vec_Int_t * vMemory, int fTryBoth, int fReturnTt )
{
    Kit_Sop_t cRes, * pcRes = &cRes;
    Kit_Sop_t cRes2, * pcRes2 = &cRes2;
    unsigned * pResult;
    int RetValue = 0;
    assert( nVars >= 0 && nVars <= 16 );
    // prepare memory manager
    Vec_IntClear( vMemory );
    Vec_IntGrow( vMemory, KIT_ISOP_MEM_LIMIT );
    // compute ISOP for the direct polarity
    Kit_TruthNot( puTruth0, puTruth0, nVars );
    pResult = Kit_TruthIsop_rec( puTruth1, puTruth0, nVars, pcRes, vMemory );
    Kit_TruthNot( puTruth0, puTruth0, nVars );
    if ( pcRes->nCubes == -1 )
    {
        vMemory->nSize = -1;
        return -1;
    }
    assert( Kit_TruthIsImply( puTruth1, pResult, nVars ) );
    Kit_TruthNot( puTruth0, puTruth0, nVars );
    assert( Kit_TruthIsImply( pResult, puTruth0, nVars ) );
    Kit_TruthNot( puTruth0, puTruth0, nVars );
    if ( pcRes->nCubes == 0 || (pcRes->nCubes == 1 && pcRes->pCubes[0] == 0) )
    {
        vMemory->pArray[0] = 0;
        Vec_IntShrink( vMemory, pcRes->nCubes );
        return 0;
    }
    if ( fTryBoth )
    {
        // compute ISOP for the complemented polarity
        Kit_TruthNot( puTruth1, puTruth1, nVars );
        pResult = Kit_TruthIsop_rec( puTruth0, puTruth1, nVars, pcRes2, vMemory );
        Kit_TruthNot( puTruth1, puTruth1, nVars );
        if ( pcRes2->nCubes >= 0 )
        {
            assert( Kit_TruthIsImply( puTruth0, pResult, nVars ) );
            Kit_TruthNot( puTruth1, puTruth1, nVars );
            assert( Kit_TruthIsImply( pResult, puTruth1, nVars ) );
            Kit_TruthNot( puTruth1, puTruth1, nVars );
            if ( pcRes->nCubes > pcRes2->nCubes || (pcRes->nCubes == pcRes2->nCubes && pcRes->nLits > pcRes2->nLits) )
            {
                RetValue = 1;
                pcRes = pcRes2;
            }
        }
    }
//    printf( "%d ", vMemory->nSize );
    // move the cover representation to the beginning of the memory buffer
    if ( fReturnTt )
    {
        int nWords = Kit_TruthWordNum( nVars );
        memmove( vMemory->pArray, pResult, nWords * sizeof(unsigned) );
        Vec_IntShrink( vMemory, nWords );
    }
    else
    {
        memmove( vMemory->pArray, pcRes->pCubes, pcRes->nCubes * sizeof(unsigned) );
        Vec_IntShrink( vMemory, pcRes->nCubes );
    }
    return RetValue;
}